

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

LogicalExpr * __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<ExprPrinter>>
::ReadLogicalExpr_abi_cxx11_
          (LogicalExpr *__return_storage_ptr__,
          NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<ExprPrinter>>
          *this,int opcode)

{
  Kind KVar1;
  char *pcVar2;
  int iVar3;
  long *plVar4;
  NumericExpr lhs;
  CountArgHandler args;
  LogicalExpr else_expr;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>::NumericExprReader>
  local_1e8;
  LogicalExpr local_1a8;
  LogicalExpr local_180;
  long *local_160 [2];
  long local_150 [2];
  long *local_140 [2];
  long local_130 [2];
  size_type *local_120 [2];
  size_type local_110 [2];
  long *local_100 [2];
  long local_f0 [2];
  long *local_e0 [2];
  long local_d0 [2];
  long *local_c0 [2];
  long local_b0 [2];
  long *local_a0 [2];
  long local_90 [2];
  long *local_80 [2];
  long local_70 [2];
  LogicalExpr local_60;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  KVar1 = OpCodeInfo::INFO[opcode].first_kind;
  if ((int)KVar1 < 0x3b) {
    if (KVar1 != NOT) {
      if (KVar1 == FIRST_BINARY_LOGICAL) {
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
        ::
        BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>::LogicalExprReader>
        ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>::LogicalExprReader>
                           *)&local_1e8,
                          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                           *)this);
        local_e0[0] = local_d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_e0,local_1e8.lhs._M_dataplus._M_p,
                   local_1e8.lhs._M_dataplus._M_p + local_1e8.lhs._M_string_length);
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_80,local_1e8.rhs._M_dataplus._M_p,
                   local_1e8.rhs._M_dataplus._M_p + local_1e8.rhs._M_string_length);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
        plVar4 = local_e0[0];
        if (local_e0[0] != local_d0) {
LAB_0012b30e:
          operator_delete(plVar4,local_d0[0] + 1);
        }
      }
      else {
        if (KVar1 != FIRST_RELATIONAL) goto switchD_0012aef4_caseD_3c;
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
        ::
        BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>::NumericExprReader>
        ::BinaryArgReader(&local_1e8,
                          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                           *)this);
        local_100[0] = local_f0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_100,local_1e8.lhs._M_dataplus._M_p,
                   local_1e8.lhs._M_dataplus._M_p + local_1e8.lhs._M_string_length);
        local_a0[0] = local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a0,local_1e8.rhs._M_dataplus._M_p,
                   local_1e8.rhs._M_dataplus._M_p + local_1e8.rhs._M_string_length);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0],local_90[0] + 1);
        }
        local_d0[0] = local_f0[0];
        plVar4 = local_100[0];
        if (local_100[0] != local_f0) goto LAB_0012b30e;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.rhs._M_dataplus._M_p != &local_1e8.rhs.field_2) goto LAB_0012b329;
      goto LAB_0012b331;
    }
    ReadLogicalExpr_abi_cxx11_(&local_60,this);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0012b344;
  }
  switch(KVar1) {
  case ATLEAST:
    plVar4 = *(long **)this;
    pcVar2 = (char *)*plVar4;
    plVar4[3] = (long)pcVar2;
    *plVar4 = (long)(pcVar2 + 1);
    ReadNumericExpr_abi_cxx11_(&local_1e8.lhs,this,*pcVar2,false);
    plVar4 = *(long **)this;
    pcVar2 = (char *)*plVar4;
    plVar4[3] = (long)pcVar2;
    *plVar4 = (long)(pcVar2 + 1);
    if ((*pcVar2 != 'o') ||
       (iVar3 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                ::ReadOpCode((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                              *)this), OpCodeInfo::INFO[iVar3].kind != COUNT)) {
      local_180._M_string_length = (size_type)&local_1a8;
      local_1a8._M_dataplus._M_p = (pointer)0x0;
      local_1a8._M_string_length = 0;
      local_180._M_dataplus._M_p = (pointer)0x0;
      BinaryReaderBase::ReportError
                (*(BinaryReaderBase **)this,(CStringRef)0x139fd1,(ArgList *)&local_180);
    }
    local_120[0] = local_110;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_120,local_1e8.lhs._M_dataplus._M_p,
               local_1e8.lhs._M_dataplus._M_p + local_1e8.lhs._M_string_length);
    iVar3 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
            ::ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                           *)this,1);
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<ExprPrinter>>::LogicalExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (this,iVar3,(ArgHandler *)&local_1a8);
    local_40 = local_30;
    local_38 = 0;
    local_30[0] = 0;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_1e8.rhs.field_2._M_allocated_capacity = local_110[0];
    local_1e8.rhs._M_dataplus._M_p = (pointer)local_120[0];
    if (local_120[0] != local_110) {
LAB_0012b329:
      operator_delete(local_1e8.rhs._M_dataplus._M_p,local_1e8.rhs.field_2._M_allocated_capacity + 1
                     );
    }
    break;
  default:
switchD_0012aef4_caseD_3c:
    local_1e8.lhs._M_dataplus._M_p = (pointer)0x0;
    local_1e8.lhs._M_string_length = 0;
    local_1a8._M_dataplus._M_p = (pointer)0x0;
    local_1a8._M_string_length = (size_type)&local_1e8;
    BinaryReaderBase::ReportError
              (*(BinaryReaderBase **)this,(CStringRef)0x139feb,(ArgList *)&local_1a8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    goto LAB_0012b380;
  case IMPLICATION:
    ReadLogicalExpr_abi_cxx11_(&local_1e8.lhs,this);
    ReadLogicalExpr_abi_cxx11_(&local_1a8,this);
    ReadLogicalExpr_abi_cxx11_(&local_180,this);
    local_140[0] = local_130;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_140,local_1e8.lhs._M_dataplus._M_p,
               local_1e8.lhs._M_dataplus._M_p + local_1e8.lhs._M_string_length);
    local_160[0] = local_150;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_160,local_1a8._M_dataplus._M_p,
               local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
    local_c0[0] = local_b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c0,local_180._M_dataplus._M_p,
               local_180._M_dataplus._M_p + (long)(_Alloc_hider *)local_180._M_string_length);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0],local_b0[0] + 1);
    }
    if (local_160[0] != local_150) {
      operator_delete(local_160[0],local_150[0] + 1);
    }
    if (local_140[0] != local_130) {
      operator_delete(local_140[0],local_130[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    local_1e8.rhs.field_2._M_allocated_capacity = local_1a8.field_2._M_allocated_capacity;
    local_1e8.rhs._M_dataplus._M_p = local_1a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) goto LAB_0012b329;
    break;
  case EXISTS:
    iVar3 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
            ::ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                           *)this,3);
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<ExprPrinter>>::LogicalExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (this,iVar3,(ArgHandler *)&local_1e8);
    goto LAB_0012b0df;
  case ALLDIFF:
    iVar3 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
            ::ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                           *)this,1);
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<ExprPrinter>>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (this,iVar3,(ArgHandler *)&local_1e8);
LAB_0012b0df:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
LAB_0012b380:
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
LAB_0012b331:
  local_60.field_2._M_allocated_capacity = local_1e8.lhs.field_2._M_allocated_capacity;
  local_60._M_dataplus._M_p = local_1e8.lhs._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.lhs._M_dataplus._M_p != &local_1e8.lhs.field_2) {
LAB_0012b344:
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

typename Handler::LogicalExpr
    NLReader<Reader, Handler>::ReadLogicalExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::NOT:
    return handler_.OnNot(ReadLogicalExpr());
  case expr::FIRST_BINARY_LOGICAL: {
    BinaryArgReader<LogicalExprReader> args(*this);
    return handler_.OnBinaryLogical(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_RELATIONAL: {
    BinaryArgReader<> args(*this);
    return handler_.OnRelational(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_LOGICAL_COUNT: {
    NumericExpr lhs = ReadNumericExpr();
    char c = reader_.ReadChar();
    if (c != 'o' || internal::GetOpCodeInfo(ReadOpCode()).kind != expr::COUNT)
      reader_.ReportError("expected count expression");
    return handler_.OnLogicalCount(kind, lhs, ReadCountExpr());
  }
  case expr::IMPLICATION: {
    // Read an implication (=>).
    LogicalExpr condition = ReadLogicalExpr();
    LogicalExpr then_expr = ReadLogicalExpr();
    LogicalExpr else_expr = ReadLogicalExpr();
    return handler_.OnImplication(condition, then_expr, else_expr);
  }
  case expr::FIRST_ITERATED_LOGICAL: {
    // Read an iterated logical expression (exists or forall).
    int num_args = ReadNumArgs();
    typename Handler::LogicalArgHandler args =
        handler_.BeginIteratedLogical(kind, num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndIteratedLogical(args);
  }
  case expr::FIRST_PAIRWISE: {
    // Read a pairwise expression (alldiff or !alldiff).
    int num_args = ReadNumArgs(1);
    typename Handler::PairwiseArgHandler args =
        handler_.BeginPairwise(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndPairwise(args);
  }
  default:
    reader_.ReportError("expected logical expression opcode");
  }
  return LogicalExpr();
}